

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

void pop_source(Context_conflict1 *ctx)

{
  IncludeState *pIVar1;
  Conditional *pCVar2;
  Conditional *pCVar3;
  
  pIVar1 = ctx->include_stack;
  if (pIVar1 != (IncludeState *)0x0) {
    if (pIVar1->close_callback != (MOJOSHADER_includeClose)0x0) {
      (*pIVar1->close_callback)(pIVar1->source_base,ctx->malloc,ctx->free,ctx->malloc_data);
    }
    pCVar3 = pIVar1->conditional_stack;
    while (pCVar3 != (Conditional *)0x0) {
      pCVar2 = pCVar3->next;
      pCVar3->next = ctx->conditional_pool;
      ctx->conditional_pool = pCVar3;
      pCVar3 = pCVar2;
    }
    ctx->include_stack = pIVar1->next;
    pIVar1->next = ctx->include_pool;
    ctx->include_pool = pIVar1;
    return;
  }
  __assert_fail("state != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x23c,"void pop_source(Context *)");
}

Assistant:

static void pop_source(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    assert(state != NULL);  // more pops than pushes!
    if (state == NULL)
        return;

    if (state->close_callback)
    {
        state->close_callback(state->source_base, ctx->malloc,
                              ctx->free, ctx->malloc_data);
    } // if

    // state->filename is a pointer to the filename cache; don't free it here!

    Conditional *cond = state->conditional_stack;
    while (cond)
    {
        Conditional *next = cond->next;
        put_conditional(ctx, cond);
        cond = next;
    } // while

    ctx->include_stack = state->next;

    print_debug_lexing_position(ctx->include_stack);

    put_include(ctx, state);
}